

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O3

void embree::GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::fix_quad_ring_order
               (array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_16UL> *patches)

{
  DynamicStackArray<float,_16UL,_64UL> *pDVar1;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar2;
  DynamicStackArray<float,_16UL,_64UL> *pDVar3;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar4;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> *pCVar5;
  CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *pCVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  CatmullClark1Ring patches2ring3;
  CatmullClark1Ring patches2ring2;
  CatmullClark1Ring patches1ring1;
  CatmullClark1Ring patches3ring3;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> local_d80;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> local_a40;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> local_700;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa> local_3c0;
  
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::CatmullClark1RingT
            (&local_700,patches->items[1].ring.items + 1);
  uVar9 = patches->items[1].ring.items[0].face_valence;
  uVar10 = patches->items[1].ring.items[0].edge_valence;
  fVar11 = patches->items[1].ring.items[0].vertex_crease_weight;
  patches->items[1].ring.items[1].border_index = patches->items[1].ring.items[0].border_index;
  patches->items[1].ring.items[1].face_valence = uVar9;
  patches->items[1].ring.items[1].edge_valence = uVar10;
  patches->items[1].ring.items[1].vertex_crease_weight = fVar11;
  pDVar1 = &patches->items[1].ring.items[0].crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=
            (&patches->items[1].ring.items[1].crease_weight,pDVar1);
  fVar11 = patches->items[1].ring.items[0].edge_level;
  uVar9 = patches->items[1].ring.items[0].eval_start_index;
  uVar10 = patches->items[1].ring.items[0].eval_unique_identifier;
  uVar7 = *(undefined8 *)&patches->items[1].ring.items[0].vtx.field_0;
  uVar8 = *(undefined8 *)((long)&patches->items[1].ring.items[0].vtx.field_0 + 8);
  patches->items[1].ring.items[1].vertex_level = patches->items[1].ring.items[0].vertex_level;
  patches->items[1].ring.items[1].edge_level = fVar11;
  patches->items[1].ring.items[1].eval_start_index = uVar9;
  patches->items[1].ring.items[1].eval_unique_identifier = uVar10;
  *(undefined8 *)&patches->items[1].ring.items[1].vtx.field_0 = uVar7;
  *(undefined8 *)((long)&patches->items[1].ring.items[1].vtx.field_0 + 8) = uVar8;
  pDVar2 = &patches->items[1].ring.items[0].ring;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=
            (&patches->items[1].ring.items[1].ring,pDVar2);
  uVar9 = patches->items[1].ring.items[3].face_valence;
  uVar10 = patches->items[1].ring.items[3].edge_valence;
  fVar11 = patches->items[1].ring.items[3].vertex_crease_weight;
  patches->items[1].ring.items[0].border_index = patches->items[1].ring.items[3].border_index;
  patches->items[1].ring.items[0].face_valence = uVar9;
  patches->items[1].ring.items[0].edge_valence = uVar10;
  patches->items[1].ring.items[0].vertex_crease_weight = fVar11;
  pDVar3 = &patches->items[1].ring.items[3].crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=(pDVar1,pDVar3);
  fVar11 = patches->items[1].ring.items[3].edge_level;
  uVar9 = patches->items[1].ring.items[3].eval_start_index;
  uVar10 = patches->items[1].ring.items[3].eval_unique_identifier;
  patches->items[1].ring.items[0].vertex_level = patches->items[1].ring.items[3].vertex_level;
  patches->items[1].ring.items[0].edge_level = fVar11;
  patches->items[1].ring.items[0].eval_start_index = uVar9;
  patches->items[1].ring.items[0].eval_unique_identifier = uVar10;
  uVar7 = *(undefined8 *)((long)&patches->items[1].ring.items[3].vtx.field_0 + 8);
  *(undefined8 *)&patches->items[1].ring.items[0].vtx.field_0 =
       *(undefined8 *)&patches->items[1].ring.items[3].vtx.field_0;
  *(undefined8 *)((long)&patches->items[1].ring.items[0].vtx.field_0 + 8) = uVar7;
  pDVar4 = &patches->items[1].ring.items[3].ring;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=(pDVar2,pDVar4);
  uVar9 = patches->items[1].ring.items[2].face_valence;
  uVar10 = patches->items[1].ring.items[2].edge_valence;
  fVar11 = patches->items[1].ring.items[2].vertex_crease_weight;
  patches->items[1].ring.items[3].border_index = patches->items[1].ring.items[2].border_index;
  patches->items[1].ring.items[3].face_valence = uVar9;
  patches->items[1].ring.items[3].edge_valence = uVar10;
  patches->items[1].ring.items[3].vertex_crease_weight = fVar11;
  pDVar1 = &patches->items[1].ring.items[2].crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=(pDVar3,pDVar1);
  fVar11 = patches->items[1].ring.items[2].edge_level;
  uVar9 = patches->items[1].ring.items[2].eval_start_index;
  uVar10 = patches->items[1].ring.items[2].eval_unique_identifier;
  patches->items[1].ring.items[3].vertex_level = patches->items[1].ring.items[2].vertex_level;
  patches->items[1].ring.items[3].edge_level = fVar11;
  patches->items[1].ring.items[3].eval_start_index = uVar9;
  patches->items[1].ring.items[3].eval_unique_identifier = uVar10;
  uVar7 = *(undefined8 *)((long)&patches->items[1].ring.items[2].vtx.field_0 + 8);
  *(undefined8 *)&patches->items[1].ring.items[3].vtx.field_0 =
       *(undefined8 *)&patches->items[1].ring.items[2].vtx.field_0;
  *(undefined8 *)((long)&patches->items[1].ring.items[3].vtx.field_0 + 8) = uVar7;
  pDVar2 = &patches->items[1].ring.items[2].ring;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=(pDVar4,pDVar2);
  patches->items[1].ring.items[2].border_index = local_700.border_index;
  patches->items[1].ring.items[2].face_valence = local_700.face_valence;
  patches->items[1].ring.items[2].edge_valence = local_700.edge_valence;
  patches->items[1].ring.items[2].vertex_crease_weight = local_700.vertex_crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=(pDVar1,&local_700.crease_weight);
  patches->items[1].ring.items[2].vertex_level = local_700.vertex_level;
  patches->items[1].ring.items[2].edge_level = local_700.edge_level;
  patches->items[1].ring.items[2].eval_start_index = local_700.eval_start_index;
  patches->items[1].ring.items[2].eval_unique_identifier = local_700.eval_unique_identifier;
  *(undefined8 *)&patches->items[1].ring.items[2].vtx.field_0 = local_700.vtx.field_0._0_8_;
  *(undefined8 *)((long)&patches->items[1].ring.items[2].vtx.field_0 + 8) =
       local_700.vtx.field_0._8_8_;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=(pDVar2,&local_700.ring);
  pCVar5 = patches->items[2].ring.items + 2;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::CatmullClark1RingT(&local_a40,pCVar5);
  pCVar6 = patches->items + 2;
  uVar9 = (pCVar6->ring).items[0].face_valence;
  uVar10 = patches->items[2].ring.items[0].edge_valence;
  fVar11 = patches->items[2].ring.items[0].vertex_crease_weight;
  pCVar5->border_index = (pCVar6->ring).items[0].border_index;
  pCVar5->face_valence = uVar9;
  patches->items[2].ring.items[2].edge_valence = uVar10;
  patches->items[2].ring.items[2].vertex_crease_weight = fVar11;
  pDVar1 = &patches->items[2].ring.items[0].crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=
            (&patches->items[2].ring.items[2].crease_weight,pDVar1);
  fVar11 = patches->items[2].ring.items[0].edge_level;
  uVar9 = patches->items[2].ring.items[0].eval_start_index;
  uVar10 = patches->items[2].ring.items[0].eval_unique_identifier;
  uVar7 = *(undefined8 *)&patches->items[2].ring.items[0].vtx.field_0;
  uVar8 = *(undefined8 *)((long)&patches->items[2].ring.items[0].vtx.field_0 + 8);
  patches->items[2].ring.items[2].vertex_level = patches->items[2].ring.items[0].vertex_level;
  patches->items[2].ring.items[2].edge_level = fVar11;
  patches->items[2].ring.items[2].eval_start_index = uVar9;
  patches->items[2].ring.items[2].eval_unique_identifier = uVar10;
  *(undefined8 *)&patches->items[2].ring.items[2].vtx.field_0 = uVar7;
  *(undefined8 *)((long)&patches->items[2].ring.items[2].vtx.field_0 + 8) = uVar8;
  pDVar2 = &patches->items[2].ring.items[0].ring;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=
            (&patches->items[2].ring.items[2].ring,pDVar2);
  (pCVar6->ring).items[0].border_index = local_a40.border_index;
  (pCVar6->ring).items[0].face_valence = local_a40.face_valence;
  patches->items[2].ring.items[0].edge_valence = local_a40.edge_valence;
  patches->items[2].ring.items[0].vertex_crease_weight = local_a40.vertex_crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=(pDVar1,&local_a40.crease_weight);
  patches->items[2].ring.items[0].vertex_level = local_a40.vertex_level;
  patches->items[2].ring.items[0].edge_level = local_a40.edge_level;
  patches->items[2].ring.items[0].eval_start_index = local_a40.eval_start_index;
  patches->items[2].ring.items[0].eval_unique_identifier = local_a40.eval_unique_identifier;
  *(undefined8 *)&patches->items[2].ring.items[0].vtx.field_0 = local_a40.vtx.field_0._0_8_;
  *(undefined8 *)((long)&patches->items[2].ring.items[0].vtx.field_0 + 8) =
       local_a40.vtx.field_0._8_8_;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=(pDVar2,&local_a40.ring);
  pCVar5 = patches->items[2].ring.items + 3;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::CatmullClark1RingT(&local_d80,pCVar5);
  uVar9 = patches->items[2].ring.items[1].face_valence;
  uVar10 = patches->items[2].ring.items[1].edge_valence;
  fVar11 = patches->items[2].ring.items[1].vertex_crease_weight;
  pCVar5->border_index = patches->items[2].ring.items[1].border_index;
  pCVar5->face_valence = uVar9;
  patches->items[2].ring.items[3].edge_valence = uVar10;
  patches->items[2].ring.items[3].vertex_crease_weight = fVar11;
  pDVar1 = &patches->items[2].ring.items[1].crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=
            (&patches->items[2].ring.items[3].crease_weight,pDVar1);
  fVar11 = patches->items[2].ring.items[1].edge_level;
  uVar9 = patches->items[2].ring.items[1].eval_start_index;
  uVar10 = patches->items[2].ring.items[1].eval_unique_identifier;
  uVar7 = *(undefined8 *)&patches->items[2].ring.items[1].vtx.field_0;
  uVar8 = *(undefined8 *)((long)&patches->items[2].ring.items[1].vtx.field_0 + 8);
  patches->items[2].ring.items[3].vertex_level = patches->items[2].ring.items[1].vertex_level;
  patches->items[2].ring.items[3].edge_level = fVar11;
  patches->items[2].ring.items[3].eval_start_index = uVar9;
  patches->items[2].ring.items[3].eval_unique_identifier = uVar10;
  *(undefined8 *)&patches->items[2].ring.items[3].vtx.field_0 = uVar7;
  *(undefined8 *)((long)&patches->items[2].ring.items[3].vtx.field_0 + 8) = uVar8;
  pDVar2 = &patches->items[2].ring.items[1].ring;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=
            (&patches->items[2].ring.items[3].ring,pDVar2);
  patches->items[2].ring.items[1].border_index = local_d80.border_index;
  patches->items[2].ring.items[1].face_valence = local_d80.face_valence;
  patches->items[2].ring.items[1].edge_valence = local_d80.edge_valence;
  patches->items[2].ring.items[1].vertex_crease_weight = local_d80.vertex_crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=(pDVar1,&local_d80.crease_weight);
  patches->items[2].ring.items[1].vertex_level = local_d80.vertex_level;
  patches->items[2].ring.items[1].edge_level = local_d80.edge_level;
  patches->items[2].ring.items[1].eval_start_index = local_d80.eval_start_index;
  patches->items[2].ring.items[1].eval_unique_identifier = local_d80.eval_unique_identifier;
  *(undefined8 *)&patches->items[2].ring.items[1].vtx.field_0 = local_d80.vtx.field_0._0_8_;
  *(undefined8 *)((long)&patches->items[2].ring.items[1].vtx.field_0 + 8) =
       local_d80.vtx.field_0._8_8_;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=(pDVar2,&local_d80.ring);
  pCVar5 = patches->items[3].ring.items + 3;
  CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>::CatmullClark1RingT(&local_3c0,pCVar5);
  pCVar6 = patches->items + 3;
  uVar9 = (pCVar6->ring).items[0].face_valence;
  uVar10 = patches->items[3].ring.items[0].edge_valence;
  fVar11 = patches->items[3].ring.items[0].vertex_crease_weight;
  pCVar5->border_index = (pCVar6->ring).items[0].border_index;
  pCVar5->face_valence = uVar9;
  patches->items[3].ring.items[3].edge_valence = uVar10;
  patches->items[3].ring.items[3].vertex_crease_weight = fVar11;
  pDVar1 = &patches->items[3].ring.items[0].crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=
            (&patches->items[3].ring.items[3].crease_weight,pDVar1);
  fVar11 = patches->items[3].ring.items[0].edge_level;
  uVar9 = patches->items[3].ring.items[0].eval_start_index;
  uVar10 = patches->items[3].ring.items[0].eval_unique_identifier;
  uVar7 = *(undefined8 *)&patches->items[3].ring.items[0].vtx.field_0;
  uVar8 = *(undefined8 *)((long)&patches->items[3].ring.items[0].vtx.field_0 + 8);
  patches->items[3].ring.items[3].vertex_level = patches->items[3].ring.items[0].vertex_level;
  patches->items[3].ring.items[3].edge_level = fVar11;
  patches->items[3].ring.items[3].eval_start_index = uVar9;
  patches->items[3].ring.items[3].eval_unique_identifier = uVar10;
  *(undefined8 *)&patches->items[3].ring.items[3].vtx.field_0 = uVar7;
  *(undefined8 *)((long)&patches->items[3].ring.items[3].vtx.field_0 + 8) = uVar8;
  pDVar2 = &patches->items[3].ring.items[0].ring;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=
            (&patches->items[3].ring.items[3].ring,pDVar2);
  uVar9 = patches->items[3].ring.items[1].face_valence;
  uVar10 = patches->items[3].ring.items[1].edge_valence;
  fVar11 = patches->items[3].ring.items[1].vertex_crease_weight;
  (pCVar6->ring).items[0].border_index = patches->items[3].ring.items[1].border_index;
  (pCVar6->ring).items[0].face_valence = uVar9;
  patches->items[3].ring.items[0].edge_valence = uVar10;
  patches->items[3].ring.items[0].vertex_crease_weight = fVar11;
  pDVar3 = &patches->items[3].ring.items[1].crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=(pDVar1,pDVar3);
  fVar11 = patches->items[3].ring.items[1].edge_level;
  uVar9 = patches->items[3].ring.items[1].eval_start_index;
  uVar10 = patches->items[3].ring.items[1].eval_unique_identifier;
  patches->items[3].ring.items[0].vertex_level = patches->items[3].ring.items[1].vertex_level;
  patches->items[3].ring.items[0].edge_level = fVar11;
  patches->items[3].ring.items[0].eval_start_index = uVar9;
  patches->items[3].ring.items[0].eval_unique_identifier = uVar10;
  uVar7 = *(undefined8 *)((long)&patches->items[3].ring.items[1].vtx.field_0 + 8);
  *(undefined8 *)&patches->items[3].ring.items[0].vtx.field_0 =
       *(undefined8 *)&patches->items[3].ring.items[1].vtx.field_0;
  *(undefined8 *)((long)&patches->items[3].ring.items[0].vtx.field_0 + 8) = uVar7;
  pDVar4 = &patches->items[3].ring.items[1].ring;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=(pDVar2,pDVar4);
  uVar9 = patches->items[3].ring.items[2].face_valence;
  uVar10 = patches->items[3].ring.items[2].edge_valence;
  fVar11 = patches->items[3].ring.items[2].vertex_crease_weight;
  patches->items[3].ring.items[1].border_index = patches->items[3].ring.items[2].border_index;
  patches->items[3].ring.items[1].face_valence = uVar9;
  patches->items[3].ring.items[1].edge_valence = uVar10;
  patches->items[3].ring.items[1].vertex_crease_weight = fVar11;
  pDVar1 = &patches->items[3].ring.items[2].crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=(pDVar3,pDVar1);
  fVar11 = patches->items[3].ring.items[2].edge_level;
  uVar9 = patches->items[3].ring.items[2].eval_start_index;
  uVar10 = patches->items[3].ring.items[2].eval_unique_identifier;
  patches->items[3].ring.items[1].vertex_level = patches->items[3].ring.items[2].vertex_level;
  patches->items[3].ring.items[1].edge_level = fVar11;
  patches->items[3].ring.items[1].eval_start_index = uVar9;
  patches->items[3].ring.items[1].eval_unique_identifier = uVar10;
  uVar7 = *(undefined8 *)((long)&patches->items[3].ring.items[2].vtx.field_0 + 8);
  *(undefined8 *)&patches->items[3].ring.items[1].vtx.field_0 =
       *(undefined8 *)&patches->items[3].ring.items[2].vtx.field_0;
  *(undefined8 *)((long)&patches->items[3].ring.items[1].vtx.field_0 + 8) = uVar7;
  pDVar2 = &patches->items[3].ring.items[2].ring;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=(pDVar4,pDVar2);
  patches->items[3].ring.items[2].border_index = local_3c0.border_index;
  patches->items[3].ring.items[2].face_valence = local_3c0.face_valence;
  patches->items[3].ring.items[2].edge_valence = local_3c0.edge_valence;
  patches->items[3].ring.items[2].vertex_crease_weight = local_3c0.vertex_crease_weight;
  DynamicStackArray<float,_16UL,_64UL>::operator=(pDVar1,&local_3c0.crease_weight);
  patches->items[3].ring.items[2].vertex_level = local_3c0.vertex_level;
  patches->items[3].ring.items[2].edge_level = local_3c0.edge_level;
  patches->items[3].ring.items[2].eval_start_index = local_3c0.eval_start_index;
  patches->items[3].ring.items[2].eval_unique_identifier = local_3c0.eval_unique_identifier;
  *(undefined8 *)&patches->items[3].ring.items[2].vtx.field_0 = local_3c0.vtx.field_0._0_8_;
  *(undefined8 *)((long)&patches->items[3].ring.items[2].vtx.field_0 + 8) =
       local_3c0.vtx.field_0._8_8_;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=(pDVar2,&local_3c0.ring);
  if (local_3c0.ring.data != (Vec3fa *)0x0 &&
      (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)local_3c0.ring.data != &local_3c0.ring) {
    alignedFree(local_3c0.ring.data);
  }
  if (local_3c0.crease_weight.data != (float *)0x0 &&
      (DynamicStackArray<float,_16UL,_64UL> *)local_3c0.crease_weight.data !=
      &local_3c0.crease_weight) {
    operator_delete__(local_3c0.crease_weight.data);
  }
  if (local_d80.ring.data != (Vec3fa *)0x0 &&
      (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)local_d80.ring.data != &local_d80.ring) {
    alignedFree(local_d80.ring.data);
  }
  if (local_d80.crease_weight.data != (float *)0x0 &&
      (DynamicStackArray<float,_16UL,_64UL> *)local_d80.crease_weight.data !=
      &local_d80.crease_weight) {
    operator_delete__(local_d80.crease_weight.data);
  }
  if (local_a40.ring.data != (Vec3fa *)0x0 &&
      (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)local_a40.ring.data != &local_a40.ring) {
    alignedFree(local_a40.ring.data);
  }
  if (local_a40.crease_weight.data != (float *)0x0 &&
      (DynamicStackArray<float,_16UL,_64UL> *)local_a40.crease_weight.data !=
      &local_a40.crease_weight) {
    operator_delete__(local_a40.crease_weight.data);
  }
  if (local_700.ring.data != (Vec3fa *)0x0 &&
      (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)local_700.ring.data != &local_700.ring) {
    alignedFree(local_700.ring.data);
  }
  if (local_700.crease_weight.data != (float *)0x0 &&
      (DynamicStackArray<float,_16UL,_64UL> *)local_700.crease_weight.data !=
      &local_700.crease_weight) {
    operator_delete__(local_700.crease_weight.data);
  }
  return;
}

Assistant:

static void fix_quad_ring_order (array_t<CatmullClarkPatch,GeneralCatmullClarkPatchT::SIZE>& patches)
    {
      CatmullClark1Ring patches1ring1 = patches[1].ring[1];
      patches[1].ring[1] = patches[1].ring[0]; // FIXME: optimize these assignments
      patches[1].ring[0] = patches[1].ring[3];
      patches[1].ring[3] = patches[1].ring[2];
      patches[1].ring[2] = patches1ring1;
      
      CatmullClark1Ring patches2ring2 = patches[2].ring[2];
      patches[2].ring[2] = patches[2].ring[0];
      patches[2].ring[0] = patches2ring2;
      CatmullClark1Ring patches2ring3 = patches[2].ring[3];
      patches[2].ring[3] = patches[2].ring[1];
      patches[2].ring[1] = patches2ring3;
      
      CatmullClark1Ring patches3ring3 = patches[3].ring[3];
      patches[3].ring[3] = patches[3].ring[0];
      patches[3].ring[0] = patches[3].ring[1];
      patches[3].ring[1] = patches[3].ring[2];
      patches[3].ring[2] = patches3ring3;
    }